

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void __thiscall Provider::provideStreamData(Provider *this,int objid,int generation,Pipeline *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uchar ch;
  undefined1 local_19;
  
  uVar1 = Buffer::getBuffer();
  uVar2 = Buffer::getSize();
  (**(code **)(*(long *)p + 0x10))(p,uVar1,uVar2);
  if (this->bad_length == true) {
    local_19 = 0x20;
    (**(code **)(*(long *)p + 0x10))(p,&local_19,1);
  }
  (**(code **)(*(long *)p + 0x18))(p);
  return;
}

Assistant:

void
    provideStreamData(int objid, int generation, Pipeline* p) override
    {
        // Don't change signature to use QPDFObjGen const& to detect problems forwarding to legacy
        // implementations.
        p->write(b->getBuffer(), b->getSize());
        if (this->bad_length) {
            unsigned char ch = ' ';
            p->write(&ch, 1);
        }
        p->finish();
    }